

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

bool __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::scan
          (Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits> *this)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  pointer pcVar4;
  char32_t *pcVar5;
  pointer pCVar6;
  
  std::
  vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ::resize(&this->props_,
           (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  pcVar4 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar1) {
    pCVar6 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar2 = u_hasBinaryProperty_70(*pcVar4,0x1e);
      pCVar6->uppercase = cVar2 != '\0';
      pcVar4 = pcVar4 + 1;
      pCVar6 = pCVar6 + 1;
    } while (pcVar4 != pcVar1);
  }
  if (this->case_sensitive_ != false) {
    pcVar4 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar3 = true;
    if (pcVar4 != pcVar1) {
      for (pcVar5 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar5 != (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                    super__Vector_impl_data._M_finish; pcVar5 = pcVar5 + 1) {
        if ((*pcVar5 == *pcVar4) && (pcVar4 = pcVar4 + 1, pcVar4 == pcVar1)) {
          return true;
        }
      }
      bVar3 = false;
    }
    return bVar3;
  }
  bVar3 = scan_match<false>(this);
  return bVar3;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }